

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::Utils::Program::GetResource
          (Program *this,GLenum interface,GLuint index,GLenum property,GLsizei buf_size,
          GLint *params)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  GLenum local_34;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  local_34 = property;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x9c8))
            (this->m_id,interface,index,1,&local_34,buf_size,0,params);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"GetProgramResourceiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0xbed);
  return;
}

Assistant:

void Program::GetResource(GLenum interface, GLuint index, GLenum property, GLsizei buf_size, GLint* params) const
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	GetResource(gl, m_id, interface, index, property, buf_size, params);
}